

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.h
# Opt level: O0

void __thiscall hanabi_learning_env::HanabiState::HanabiState(HanabiState *this,HanabiState *state)

{
  undefined8 uVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_00000008;
  vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
  *in_stack_00000010;
  HanabiDeck *in_stack_ffffffffffffffb8;
  HanabiDeck *in_stack_ffffffffffffffc0;
  
  *in_RDI = *in_RSI;
  HanabiDeck::HanabiDeck(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>::
  vector(in_stack_00000010,in_stack_00000008);
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  vector((vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
          *)in_stack_00000010,
         (vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
          *)in_stack_00000008);
  std::
  vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
  ::vector((vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            *)in_stack_00000010,
           (vector<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
            *)in_stack_00000008);
  uVar1 = in_RSI[0xf];
  in_RDI[0xe] = in_RSI[0xe];
  in_RDI[0xf] = uVar1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_00000010,
             (vector<int,_std::allocator<int>_> *)in_stack_00000008);
  *(undefined4 *)(in_RDI + 0x13) = *(undefined4 *)(in_RSI + 0x13);
  return;
}

Assistant:

HanabiState(const HanabiState& state) = default;